

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcRtFileFont.cpp
# Opt level: O3

GrcRtFileFont * __thiscall GrcRtFileFont::copyThis(GrcRtFileFont *this)

{
  pointer pwVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  GrcRtFileFont *pGVar10;
  
  pGVar10 = (GrcRtFileFont *)operator_new(0x68);
  pGVar10->_vptr_GrcRtFileFont = (_func_int **)&PTR_bold_00114d38;
  uVar2 = *(undefined4 *)((long)&this->m_file + 4);
  fVar3 = this->m_ascent;
  fVar4 = this->m_descent;
  fVar5 = this->m_emSquare;
  fVar6 = this->m_pointSize;
  iVar7 = this->m_dpiX;
  iVar8 = this->m_dpiY;
  *(undefined4 *)&pGVar10->m_file = *(undefined4 *)&this->m_file;
  *(undefined4 *)((long)&pGVar10->m_file + 4) = uVar2;
  pGVar10->m_ascent = fVar3;
  pGVar10->m_descent = fVar4;
  pGVar10->m_emSquare = fVar5;
  pGVar10->m_pointSize = fVar6;
  pGVar10->m_dpiX = iVar7;
  pGVar10->m_dpiY = iVar8;
  pGVar10->m_isValid = this->m_isValid;
  (pGVar10->m_stu32FaceName)._M_dataplus._M_p = (pointer)&(pGVar10->m_stu32FaceName).field_2;
  pwVar1 = (this->m_stu32FaceName)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&pGVar10->m_stu32FaceName,pwVar1,
             pwVar1 + (this->m_stu32FaceName)._M_string_length);
  fVar3 = this->m_yScale;
  pGVar10->m_xScale = this->m_xScale;
  pGVar10->m_yScale = fVar3;
  pbVar9 = this->m_pTableDir;
  pGVar10->m_pHeader = this->m_pHeader;
  pGVar10->m_pTableDir = pbVar9;
  return pGVar10;
}

Assistant:

GrcRtFileFont * GrcRtFileFont::copyThis()
{
	GrcRtFileFont * copy = new GrcRtFileFont(*this);
	return copy;
}